

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

bool __thiscall QFormLayout::isRowVisible(QFormLayout *this,QLayout *layout)

{
  long lVar1;
  bool bVar2;
  QFormLayoutPrivate *this_00;
  QLayout *in_RSI;
  QLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  QFormLayoutPrivate *d;
  ItemRole role;
  int row;
  char *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  QLayoutPrivate *this_01;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  QFormLayout *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QFormLayout *)0x4b8d3f);
  bVar2 = QLayoutPrivate::checkLayout(this_01,in_RSI);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    getLayoutPosition(in_stack_ffffffffffffffd0,
                      (QLayout *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),
                      (int *)this_01,(ItemRole *)in_RSI);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)in_RDI,in_stack_ffffffffffffffa4,
               in_stack_ffffffffffffff98);
    QMessageLogger::warning(&stack0xffffffffffffffd0,"QFormLayout::takeRow: Invalid layout");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool QFormLayout::isRowVisible(QLayout *layout) const
{
    Q_D(const QFormLayout);
    if (Q_UNLIKELY(!d->checkLayout(layout)))
        return false;
    int row;
    ItemRole role;
    getLayoutPosition(layout, &row, &role);

    if (Q_UNLIKELY(row < 0)) {
        qWarning("QFormLayout::takeRow: Invalid layout");
        return false;
    }

    return isRowVisible(row);
}